

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::GregorianCalendar::handleComputeJulianDay
          (GregorianCalendar *this,UCalendarDateFields bestField)

{
  int32_t iVar1;
  int iVar2;
  int32_t iVar3;
  char cVar4;
  
  this->fInvertGregorian = '\0';
  iVar1 = Calendar::handleComputeJulianDay(&this->super_Calendar,bestField);
  if (bestField == UCAL_WEEK_OF_YEAR) {
    iVar2 = this->fCutoverJulianDay;
    if (iVar2 <= iVar1 && (this->super_Calendar).fFields[0x13] == this->fGregorianCutoverYear) {
      this->fInvertGregorian = '\x01';
      iVar1 = Calendar::handleComputeJulianDay(&this->super_Calendar,UCAL_WEEK_OF_YEAR);
      return iVar1;
    }
  }
  else {
    iVar2 = this->fCutoverJulianDay;
  }
  cVar4 = this->fIsGregorian;
  if (iVar1 < iVar2 == (cVar4 == '\x01')) {
    this->fInvertGregorian = '\x01';
    iVar1 = Calendar::handleComputeJulianDay(&this->super_Calendar,bestField);
    cVar4 = this->fIsGregorian;
  }
  if ((cVar4 != '\0') &&
     (iVar2 = (this->super_Calendar).fFields[0x13], iVar2 == this->fGregorianCutoverYear)) {
    iVar3 = Grego::gregorianShift(iVar2);
    if (bestField == UCAL_WEEK_OF_MONTH) {
      iVar1 = iVar1 + 0xe;
    }
    else if (bestField == UCAL_DAY_OF_YEAR) {
      iVar1 = iVar1 - iVar3;
    }
  }
  return iVar1;
}

Assistant:

int32_t GregorianCalendar::handleComputeJulianDay(UCalendarDateFields bestField) 
{
    fInvertGregorian = FALSE;

    int32_t jd = Calendar::handleComputeJulianDay(bestField);

    if((bestField == UCAL_WEEK_OF_YEAR) &&  // if we are doing WOY calculations, we are counting relative to Jan 1 *julian*
        (internalGet(UCAL_EXTENDED_YEAR)==fGregorianCutoverYear) && 
        jd >= fCutoverJulianDay) { 
            fInvertGregorian = TRUE;  // So that the Julian Jan 1 will be used in handleComputeMonthStart
            return Calendar::handleComputeJulianDay(bestField);
        }


        // The following check handles portions of the cutover year BEFORE the
        // cutover itself happens.
        //if ((fIsGregorian==TRUE) != (jd >= fCutoverJulianDay)) {  /*  cutoverJulianDay)) { */
        if ((fIsGregorian==TRUE) != (jd >= fCutoverJulianDay)) {  /*  cutoverJulianDay)) { */
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: jd [invert] %d\n", 
                __FILE__, __LINE__, jd);
#endif
            fInvertGregorian = TRUE;
            jd = Calendar::handleComputeJulianDay(bestField);
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d:  fIsGregorian %s, fInvertGregorian %s - ", 
                __FILE__, __LINE__,fIsGregorian?"T":"F", fInvertGregorian?"T":"F");
            fprintf(stderr, " jd NOW %d\n", 
                jd);
#endif
        } else {
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: jd [==] %d - %sfIsGregorian %sfInvertGregorian, %d\n", 
                __FILE__, __LINE__, jd, fIsGregorian?"T":"F", fInvertGregorian?"T":"F", bestField);
#endif
        }

        if(fIsGregorian && (internalGet(UCAL_EXTENDED_YEAR) == fGregorianCutoverYear)) {
            int32_t gregShift = Grego::gregorianShift(internalGet(UCAL_EXTENDED_YEAR));
            if (bestField == UCAL_DAY_OF_YEAR) {
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: [DOY%d] gregorian shift of JD %d += %d\n", 
                    __FILE__, __LINE__, fFields[bestField],jd, gregShift);
#endif
                jd -= gregShift;
            } else if ( bestField == UCAL_WEEK_OF_MONTH ) {
                int32_t weekShift = 14;
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: [WOY/WOM] gregorian week shift of %d += %d\n", 
                    __FILE__, __LINE__, jd, weekShift);
#endif
                jd += weekShift; // shift by weeks for week based fields.
            }
        }

        return jd;
}